

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int bitfield_check(nvamemtiming_conf *conf)

{
  FILE *__stream;
  long in_RDI;
  bool bVar1;
  FILE *outf;
  char outfile [21];
  color in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  FILE *in_stack_ffffffffffffffd8;
  nvamemtiming_conf *in_stack_ffffffffffffffe0;
  uint local_4;
  
  snprintf(&stack0xffffffffffffffd8,0x14,"entry_b_%i",(ulong)*(byte *)(in_RDI + 0x10));
  __stream = fopen(&stack0xffffffffffffffd8,"wb");
  bVar1 = __stream != (FILE *)0x0;
  if (bVar1) {
    printf("Bitfield mode: test index %i\n",(ulong)*(byte *)(in_RDI + 0x10));
    launch((nvamemtiming_conf *)in_stack_ffffffffffffffd8,(FILE *)__stream,in_stack_ffffffffffffffcf
           ,in_stack_ffffffffffffffc8);
    iterate_bitfield(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                     (uint8_t)((ulong)__stream >> 0x38),(color)__stream);
    fclose(__stream);
  }
  else {
    perror("Open the output file");
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int bitfield_check(struct nvamemtiming_conf *conf)
{
	char outfile[21];

	snprintf(outfile, 20, "entry_b_%i", conf->bitfield.index);

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(outfile, "wb");
	if (!outf) {
		perror("Open the output file");
		return 1;
	}

	printf("Bitfield mode: test index %i\n", conf->bitfield.index);

	launch(conf, outf, 0, NO_COLOR);
	iterate_bitfield(conf, outf, conf->bitfield.index, COLOR);

	fclose(outf);

	return 0;
}